

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O2

unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> __thiscall
verilogAST::AssignMapBuilder::visit
          (AssignMapBuilder *this,
          unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> *node)

{
  long *in_RDX;
  long lStack_50;
  anon_class_1_0_00000001 local_39;
  string port_str;
  
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/assign_inliner.cpp:107:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
    ::_S_vtable._M_arr[*(byte *)(*in_RDX + 0x10)]._M_data)
            (&port_str,&local_39,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
              *)(*in_RDX + 8));
  if (*(int *)(*in_RDX + 0x18) == 0) {
    lStack_50 = 0x28;
  }
  else {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)node[3]._M_t.
                  super___uniq_ptr_impl<verilogAST::Port,_std::default_delete<verilogAST::Port>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_verilogAST::Port_*,_std::default_delete<verilogAST::Port>_>
                  .super__Head_base<0UL,_verilogAST::Port_*,_false>._M_head_impl,&port_str);
    if (*(int *)(*in_RDX + 0x18) != 1) goto LAB_0016c19e;
    lStack_50 = 0x20;
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            (*(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               **)((long)&(node->_M_t).
                          super___uniq_ptr_impl<verilogAST::Port,_std::default_delete<verilogAST::Port>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_verilogAST::Port_*,_std::default_delete<verilogAST::Port>_>
                          .super__Head_base<0UL,_verilogAST::Port_*,_false>._M_head_impl + lStack_50
                  ),&port_str);
LAB_0016c19e:
  (this->super_Transformer)._vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  std::__cxx11::string::~string((string *)&port_str);
  return (__uniq_ptr_data<verilogAST::Port,_std::default_delete<verilogAST::Port>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Port,_std::default_delete<verilogAST::Port>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Port> AssignMapBuilder::visit(std::unique_ptr<Port> node) {
  std::string port_str = std::visit(
      [](auto&& value) -> std::string {
        if (auto ptr = dynamic_cast<Identifier*>(value.get())) {
          return ptr->toString();
        } else if (auto ptr = dynamic_cast<Vector*>(value.get())) {
          return ptr->id->toString();
        }
        throw std::runtime_error("Unreachable");  // LCOV_EXCL_LINE
        return "";                                // LCOV_EXCL_LINE
      },
      node->value);
  if (node->direction != Direction::INPUT) {
    this->non_input_ports.insert(port_str);
    if (node->direction == Direction::OUTPUT) {
      this->output_ports.insert(port_str);
    }
  } else {
    this->input_ports.insert(port_str);
  }
  return node;
}